

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O3

void __thiscall Pathie::ErrnoError::ErrnoError(ErrnoError *this,int val)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  stringstream ss;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  PathieError::PathieError(&this->super_PathieError);
  *(undefined ***)&this->super_PathieError = &PTR__GlobError_00113bf8;
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ostream::operator<<(local_1a0,val);
  this->m_val = val;
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1f0,"Errno ",&local_1d0);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::__cxx11::string::append((char *)&local_230);
  strerror(val);
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char*>((string *)local_210,local_230,local_230 + local_228);
  std::__cxx11::string::append((char *)local_210);
  std::__cxx11::string::_M_assign((string *)&(this->super_PathieError).m_pathie_errmsg);
  if (local_210[0] != local_200) {
    operator_delete(local_210[0]);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

ErrnoError::ErrnoError(int val)
{
  std::stringstream ss;
  ss << val;

  m_val = val;
  m_pathie_errmsg = "Errno " + ss.str() + ": " + strerror(val);
}